

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O2

void __thiscall MIDI::MidiInput::~MidiInput(MidiInput *this)

{
  return;
}

Assistant:

MidiInput::~MidiInput()
    {
    #if PLATFORM_WIN
        if (m_midihandle)
        {
            midiInStop(m_midihandle);
            midiInClose(m_midihandle);
        }
    #elif PLATFORM_OSX
        // TODO
    #endif
    }